

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
          (SmallVectorBase<const_slang::ast::VariableSymbol_*> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  VariableSymbol **__ofirst;
  uninitialized_copy_result<const_slang::ast::VariableSymbol_*const_*,_const_slang::ast::VariableSymbol_**>
  uVar1;
  pointer dest;
  undefined1 in_stack_ffffffffffffffc8 [16];
  VariableSymbol **__olast;
  BumpAllocator *in_stack_ffffffffffffffd8;
  SmallVectorBase<const_slang::ast::VariableSymbol_*> *__ifirst;
  int iVar2;
  __uninitialized_copy_fn *in_stack_fffffffffffffff0;
  
  __olast = in_stack_ffffffffffffffc8._8_8_;
  if (this->len == 0) {
    std::span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL>::span
              ((span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL> *)0xa3d459);
    iVar2 = (int)in_stack_fffffffffffffff0;
  }
  else {
    __ifirst = this;
    __ofirst = (VariableSymbol **)
               BumpAllocator::allocate
                         (in_stack_ffffffffffffffd8,(size_t)__olast,in_stack_ffffffffffffffc8._0_8_)
    ;
    begin(this);
    end(this);
    uVar1 = std::ranges::__uninitialized_copy_fn::
            operator()<const_slang::ast::VariableSymbol_*const_*,_const_slang::ast::VariableSymbol_*const_*,_const_slang::ast::VariableSymbol_**,_const_slang::ast::VariableSymbol_**>
                      (in_stack_fffffffffffffff0,(VariableSymbol **)__ifirst,(VariableSymbol **)dst,
                       __ofirst,__olast);
    iVar2 = (int)in_stack_fffffffffffffff0;
    std::span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL>::
    span<const_slang::ast::VariableSymbol_**>
              ((span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL> *)uVar1.out,
               uVar1.in,(size_type)this);
  }
  return iVar2;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }